

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_emptytableref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::Bind(Binder *this,EmptyTableRef *ref)

{
  idx_t local_20;
  element_type *local_18;
  
  local_20 = GenerateTableIndex((Binder *)ref);
  make_uniq<duckdb::BoundEmptyTableRef,unsigned_long>((duckdb *)&local_18,&local_20);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_18;
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::Bind(EmptyTableRef &ref) {
	return make_uniq<BoundEmptyTableRef>(GenerateTableIndex());
}